

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O3

Box2i __thiscall
Imf_3_4::dataWindowForTile
          (Imf_3_4 *this,TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int dx,int dy
          ,int lx,int ly)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  Box2i BVar8;
  
  iVar6 = dx * tileDesc->xSize + minX;
  iVar7 = dy * tileDesc->ySize + minY;
  lVar5 = (ulong)tileDesc->xSize + (long)iVar6 + -1;
  lVar1 = ((ulong)tileDesc->ySize - 1) + (long)iVar7;
  iVar2 = levelSize(minX,maxX,lx,tileDesc->roundingMode);
  iVar3 = levelSize(minY,maxY,ly,tileDesc->roundingMode);
  lVar4 = (long)(minX + iVar2 + -1);
  if (lVar5 < lVar4) {
    lVar4 = lVar5;
  }
  lVar5 = (long)(iVar3 + minY + -1);
  if (lVar1 < lVar5) {
    lVar5 = lVar1;
  }
  *(int *)this = iVar6;
  *(int *)(this + 4) = iVar7;
  *(int *)(this + 8) = (int)lVar4;
  *(int *)(this + 0xc) = (int)lVar5;
  BVar8.max = (Vec2<int>)(long)iVar7;
  BVar8.min = (Vec2<int>)this;
  return BVar8;
}

Assistant:

Box2i
dataWindowForTile (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int                    dx,
    int                    dy,
    int                    lx,
    int                    ly)
{
    V2i tileMin = V2i (minX + dx * tileDesc.xSize, minY + dy * tileDesc.ySize);

    int64_t tileMaxX = int64_t (tileMin[0]) + tileDesc.xSize - 1;
    int64_t tileMaxY = int64_t (tileMin[1]) + tileDesc.ySize - 1;

    V2i levelMax =
        dataWindowForLevel (tileDesc, minX, maxX, minY, maxY, lx, ly).max;

    V2i tileMax = V2i (
        std::min (tileMaxX, int64_t (levelMax[0])),
        std::min (tileMaxY, int64_t (levelMax[1])));

    return Box2i (tileMin, tileMax);
}